

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameter.cc
# Opt level: O2

void __thiscall
gutil::Parameter::Parameter(Parameter *this,int argc,char **argv,char **pdef,char *creator)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  int iVar3;
  IOException *this_00;
  long lVar4;
  allocator local_2a1;
  string *local_2a0;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_298;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_290;
  char *local_288;
  long local_280;
  string s;
  string local_258;
  ifstream in;
  size_type local_230;
  int aiStack_218 [122];
  
  local_290 = &this->def;
  local_2a0 = &this->creat;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->def).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->list).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->creat)._M_dataplus._M_p = (pointer)&(this->creat).field_2;
  (this->creat)._M_string_length = 0;
  (this->creat).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->allparam)._M_t._M_impl.super__Rb_tree_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->allparam)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_298 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
               *)&this->allparam;
  local_280 = (long)argc;
  lVar4 = 1;
  local_288 = creator;
  do {
    pcVar2 = local_288;
    if (local_280 <= lVar4) {
      for (; *pdef != (char *)0x0; pdef = pdef + 1) {
        std::__cxx11::string::string((string *)&in,*pdef,(allocator *)&s);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(local_290,(value_type *)&in);
        anon_unknown_4::getValue(&s,(value_type *)&in);
        std::__cxx11::string::operator=((string *)&in,(string *)&s);
        std::__cxx11::string::~string((string *)&s);
        if ((local_230 != 0) && (*_in == '-')) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>(local_298,(value_type *)&in);
        }
        std::__cxx11::string::~string((string *)&in);
      }
      if (pcVar2 != (char *)0x0) {
        std::__cxx11::string::assign((char *)local_2a0);
      }
      this->cparam = 0xffffffffffffffff;
      this->pos = 0;
      return;
    }
    if (*argv[lVar4] == '@') {
      std::ifstream::ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
      s._M_dataplus._M_p = (pointer)&s.field_2;
      s._M_string_length = 0;
      s.field_2._M_local_buf[0] = '\0';
      std::ios::exceptions
                ((int)*(undefined8 *)(_in + -0x18) +
                 (int)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
      std::ifstream::open((char *)&in,(int)argv[lVar4] + _S_app);
      if (*(int *)((long)aiStack_218 + *(long *)(_in + -0x18)) != 0) {
        this_00 = (IOException *)__cxa_allocate_exception(0x28);
        std::__cxx11::string::string((string *)&local_258,argv[lVar4] + 1,&local_2a1);
        IOException::IOException(this_00,&local_258);
        __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
      }
      iVar3 = 0;
      while (iVar3 == 0) {
        std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&in,(string *)&s);
        trim(&s);
        if (s._M_string_length != 0) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&this->list,&s);
        }
        iVar3 = *(int *)((long)aiStack_218 + *(long *)(_in + -0x18));
      }
      std::ifstream::close();
      std::__cxx11::string::~string((string *)&s);
      std::ifstream::~ifstream
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
    }
    else {
      std::__cxx11::string::string((string *)&in,argv[lVar4],(allocator *)&s);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in);
      std::__cxx11::string::~string((string *)&in);
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

Parameter::Parameter(int argc, char *argv[], const char *pdef[],
                     const char *creator)
{
  for (int i=1; i<argc; i++)
  {
    if (argv[i][0] == '@')
    {
      std::ifstream in;
      std::string s;

      in.exceptions(std::ios_base::badbit);
      in.open(argv[i]+1);

      if (!in.good())
      {
        throw IOException(argv[i]+1);
      }

      while (in.good())
      {
        getline(in, s);

        trim(s);

        if (s.size() > 0)
        {
          list.push_back(s);
        }
      }

      in.close();
    }
    else
    {
      list.push_back(std::string(argv[i]));
    }
  }

  for (int i=0; pdef[i] != 0; i++)
  {
    std::string s=pdef[i];
    def.push_back(s);

    s=getValue(s);

    if (s.size() > 0 && s[0] == '-')
    {
      allparam.insert(s);
    }
  }

  if (creator != 0)
  {
    creat=creator;
  }

  cparam=-1;
  pos=0;
}